

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void statPush(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  tRowcnt *ptVar1;
  uint uVar2;
  tRowcnt *ptVar3;
  sqlite3_value *pMem;
  sqlite3 *db;
  Stat4Sample *pSVar4;
  int iVar5;
  u32 uVar6;
  Stat4Accum *p;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  u8 *pData;
  i64 iRowid;
  ulong uVar10;
  Stat4Sample *p_00;
  long lVar11;
  int iChng;
  
  p = (Stat4Accum *)sqlite3_value_blob(*argv);
  uVar7 = sqlite3VdbeIntValue(argv[1]);
  iChng = (int)uVar7;
  if (p->nRow == 0) {
    for (lVar9 = 0; lVar9 < p->nCol; lVar9 = lVar9 + 1) {
      (p->current).anEq[lVar9] = 1;
    }
  }
  else {
    samplePushPrevious(p,iChng);
    uVar8 = 0;
    uVar10 = 0;
    if (0 < iChng) {
      uVar10 = uVar7 & 0xffffffff;
    }
    for (; uVar10 != uVar8; uVar8 = uVar8 + 1) {
      ptVar1 = (p->current).anEq + uVar8;
      *ptVar1 = *ptVar1 + 1;
    }
    for (lVar9 = (long)iChng; lVar9 < p->nCol; lVar9 = lVar9 + 1) {
      ptVar1 = (p->current).anDLt + lVar9;
      *ptVar1 = *ptVar1 + 1;
      ptVar3 = (p->current).anEq;
      ptVar1 = (p->current).anLt + lVar9;
      *ptVar1 = *ptVar1 + ptVar3[lVar9];
      ptVar3[lVar9] = 1;
    }
  }
  p->nRow = p->nRow + 1;
  pMem = argv[2];
  uVar2._0_2_ = pMem->flags;
  uVar2._2_1_ = pMem->enc;
  uVar2._3_1_ = pMem->eSubtype;
  p_00 = &p->current;
  db = p->db;
  if ((0x50505050U >> (uVar2 & 0x1f) & 1) == 0) {
    iVar5 = sqlite3_value_bytes(pMem);
    pData = (u8 *)sqlite3_value_blob(argv[2]);
    sampleSetRowid(db,p_00,iVar5,pData);
  }
  else {
    iRowid = sqlite3VdbeIntValue(pMem);
    sampleSetRowidInt64(db,p_00,iRowid);
  }
  uVar6 = p->iPrn * 0x41c64e6d + 0x3039;
  p->iPrn = uVar6;
  (p->current).iHash = uVar6;
  iVar5 = p->nCol;
  uVar2 = (p->current).anLt[(long)iVar5 + -1];
  if (uVar2 / p->nPSample != (uVar2 + 1) / p->nPSample) {
    (p->current).isPSample = '\x01';
    (p->current).iCol = 0;
    sampleInsert(p,p_00,iVar5 + -1);
    (p->current).isPSample = '\0';
  }
  lVar11 = 0;
  lVar9 = 0;
  do {
    if ((long)p->nCol + -1 <= lVar9) {
      return;
    }
    (p->current).iCol = (int)lVar9;
    pSVar4 = p->aBest;
    if (lVar9 < iChng) {
      iVar5 = sampleIsBetterPost(p,p_00,(Stat4Sample *)((long)&pSVar4->anEq + lVar11));
      if (iVar5 != 0) goto LAB_00182aba;
    }
    else {
LAB_00182aba:
      sampleCopy(p,(Stat4Sample *)((long)&pSVar4->anEq + lVar11),p_00);
    }
    lVar9 = lVar9 + 1;
    lVar11 = lVar11 + 0x30;
  } while( true );
}

Assistant:

static void statPush(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int i;

  /* The three function arguments */
  Stat4Accum *p = (Stat4Accum*)sqlite3_value_blob(argv[0]);
  int iChng = sqlite3_value_int(argv[1]);

  UNUSED_PARAMETER( argc );
  UNUSED_PARAMETER( context );
  assert( p->nCol>0 );
  assert( iChng<p->nCol );

  if( p->nRow==0 ){
    /* This is the first call to this function. Do initialization. */
    for(i=0; i<p->nCol; i++) p->current.anEq[i] = 1;
  }else{
    /* Second and subsequent calls get processed here */
    samplePushPrevious(p, iChng);

    /* Update anDLt[], anLt[] and anEq[] to reflect the values that apply
    ** to the current row of the index. */
    for(i=0; i<iChng; i++){
      p->current.anEq[i]++;
    }
    for(i=iChng; i<p->nCol; i++){
      p->current.anDLt[i]++;
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
      p->current.anLt[i] += p->current.anEq[i];
#endif
      p->current.anEq[i] = 1;
    }
  }
  p->nRow++;
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  if( sqlite3_value_type(argv[2])==SQLITE_INTEGER ){
    sampleSetRowidInt64(p->db, &p->current, sqlite3_value_int64(argv[2]));
  }else{
    sampleSetRowid(p->db, &p->current, sqlite3_value_bytes(argv[2]),
                                       sqlite3_value_blob(argv[2]));
  }
  p->current.iHash = p->iPrn = p->iPrn*1103515245 + 12345;
#endif

#ifdef SQLITE_ENABLE_STAT4
  {
    tRowcnt nLt = p->current.anLt[p->nCol-1];

    /* Check if this is to be a periodic sample. If so, add it. */
    if( (nLt/p->nPSample)!=(nLt+1)/p->nPSample ){
      p->current.isPSample = 1;
      p->current.iCol = 0;
      sampleInsert(p, &p->current, p->nCol-1);
      p->current.isPSample = 0;
    }

    /* Update the aBest[] array. */
    for(i=0; i<(p->nCol-1); i++){
      p->current.iCol = i;
      if( i>=iChng || sampleIsBetterPost(p, &p->current, &p->aBest[i]) ){
        sampleCopy(p, &p->aBest[i], &p->current);
      }
    }
  }
#endif
}